

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void initialize_test(int *argcp,char ***argvp,IceTCommunicator comm)

{
  char **argv;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char *__format;
  int iVar10;
  char filename [64];
  uint local_a0;
  IceTSizeType local_9c;
  IceTSizeType local_94;
  char local_78 [72];
  
  iVar6 = *argcp;
  argv = *argvp;
  uVar2 = (*comm->Comm_rank)(comm);
  iVar3 = (*comm->Comm_size)(comm);
  uVar8 = 1;
  if (iVar6 < 2) {
    local_94 = 0x400;
    bVar1 = false;
    local_a0 = 0xffff;
    local_9c = 0x300;
    iVar10 = 1;
  }
  else {
    local_9c = 0x300;
    local_a0 = 0xffff;
    bVar1 = false;
    local_94 = 0x400;
    iVar10 = 1;
    do {
      pcVar9 = argv[iVar10];
      iVar4 = strcmp(pcVar9,"-width");
      if (iVar4 == 0) {
        iVar4 = iVar10 + 1;
        local_94 = atoi(argv[(long)iVar10 + 1]);
      }
      else {
        iVar4 = strcmp(pcVar9,"-height");
        if (iVar4 == 0) {
          iVar4 = iVar10 + 1;
          local_9c = atoi(argv[(long)iVar10 + 1]);
        }
        else {
          iVar5 = strcmp(pcVar9,"-nologdebug");
          iVar4 = iVar10;
          if (iVar5 == 0) {
            local_a0 = local_a0 & 0x103;
          }
          else {
            iVar5 = strcmp(pcVar9,"-redirect");
            if (iVar5 != 0) {
              iVar4 = strcmp(pcVar9,"-h");
              if ((iVar4 == 0) || (iVar4 = strcmp(pcVar9,"-help"), iVar4 == 0)) {
                usage(argv);
                exit(0);
              }
              iVar4 = strcmp(pcVar9,"-R");
              if ((iVar4 != 0) && (*pcVar9 == '-')) {
                iVar4 = strcmp(pcVar9,"--");
                if (iVar4 != 0) {
                  __format = "Unknown options `%s\'.  Try -h for help.\n";
                  goto LAB_0010946e;
                }
                iVar10 = iVar10 + 1;
              }
              break;
            }
            bVar1 = true;
          }
        }
      }
      iVar10 = iVar4 + 1;
    } while (iVar10 < iVar6);
  }
  if (iVar10 < iVar6) {
    uVar8 = 1;
    do {
      argv[uVar8] = argv[(long)iVar10 + (uVar8 - 1)];
      uVar8 = uVar8 + 1;
    } while ((iVar6 - iVar10) + 1 != uVar8);
  }
  uVar7 = (uint)uVar8;
  *argcp = uVar7;
  if (uVar7 < 2 && 1 < iVar3) {
    pcVar9 = "You must select a test on the command line when using more than one process.";
  }
  else {
    if (!bVar1 || 1 < uVar7) {
      SCREEN_WIDTH = local_94;
      SCREEN_HEIGHT = local_9c;
      context = icetCreateContext(comm);
      icetDiagnostics(local_a0);
      if (!bVar1) {
        realstdout = _stdout;
        strategy_list[0] = 0x6001;
        strategy_list[1] = 0x6002;
        strategy_list[2] = 0x6003;
        strategy_list[3] = 0x6004;
        strategy_list[4] = 0x6005;
        single_image_strategy_list[0] = 0x7001;
        single_image_strategy_list[1] = 0x7002;
        single_image_strategy_list[2] = 0x7004;
        single_image_strategy_list[3] = 0x7003;
        return;
      }
      if (uVar2 == 0) {
        iVar6 = dup(1);
        realstdout = (FILE *)fdopen(iVar6,"wt");
      }
      sprintf(local_78,"log.%04d",(ulong)uVar2);
      iVar6 = open(local_78,0x441,0x1a4);
      if (-1 < iVar6) {
        dup2(iVar6,1);
        strategy_list[0] = 0x6001;
        strategy_list[1] = 0x6002;
        strategy_list[2] = 0x6003;
        strategy_list[3] = 0x6004;
        strategy_list[4] = 0x6005;
        single_image_strategy_list[0] = 0x7001;
        single_image_strategy_list[1] = 0x7002;
        single_image_strategy_list[2] = 0x7004;
        single_image_strategy_list[3] = 0x7003;
        return;
      }
      __format = "Could not open %s for writing.\n";
      pcVar9 = local_78;
LAB_0010946e:
      printf(__format,pcVar9);
      goto LAB_00109475;
    }
    pcVar9 = "You must select a test on the command line when redirecting the output.";
  }
  puts(pcVar9);
  puts("Try -h for help.");
LAB_00109475:
  exit(1);
}

Assistant:

void initialize_test(int *argcp, char ***argvp, IceTCommunicator comm)
{
    int arg;
    int argc = *argcp;
    char **argv = *argvp;
    int width = 1024;
    int height = 768;
    IceTBitField diag_level = ICET_DIAG_FULL;
    int redirect = 0;
    int rank, num_proc;

    rank = (*comm->Comm_rank)(comm);
    num_proc = (*comm->Comm_size)(comm);

  /* This is convenient code to attach a debugger to a particular process at the
     start of a test. */
    /* if (rank == 0) { */
    /*     int i = 0; */
    /*     printf("Waiting in process %d\n", getpid()); */
    /*     while (i == 0) sleep(1); */
    /* } */

#ifdef ICET_TESTS_USE_OPENGL
  /* Let Glut have first pass at the arguments to grab any that it can use. */
    glutInit(argcp, *argvp);
#endif

  /* Parse my arguments. */
    for (arg = 1; arg < argc; arg++) {
        if (strcmp(argv[arg], "-width") == 0) {
            width = atoi(argv[++arg]);
        } else if (strcmp(argv[arg], "-height") == 0) {
            height = atoi(argv[++arg]);
        } else if (strcmp(argv[arg], "-nologdebug") == 0) {
            diag_level &= ICET_DIAG_WARNINGS | ICET_DIAG_ALL_NODES;
        } else if (strcmp(argv[arg], "-redirect") == 0) {
            redirect = 1;
        } else if (   (strcmp(argv[arg], "-h") == 0)
                   || (strcmp(argv[arg], "-help") == 0) ) {
            usage(argv);
            exit(0);
        } else if (   (strcmp(argv[arg], "-R") == 0)
                   || (strncmp(argv[arg], "-", 1) != 0) ) {
            break;
        } else if (strcmp(argv[arg], "--") == 0) {
            arg++;
            break;
        } else {
            printf("Unknown options `%s'.  Try -h for help.\n", argv[arg]);
            exit(1);
        }
    }

  /* Fix arguments for next bout of parsing. */
    *argcp = 1;
    for ( ; arg < argc; arg++, (*argcp)++) {
        argv[*argcp] = argv[arg];
    }
    argc = *argcp;

  /* Make sure selected options are consistent. */
    if ((num_proc > 1) && (argc < 2)) {
        printf("You must select a test on the command line when using more than one process.\n");
        printf("Try -h for help.\n");
        exit(1);
    }
    if (redirect && (argc < 2)) {
        printf("You must select a test on the command line when redirecting the output.\n");
        printf("Try -h for help.\n");
        exit(1);
    }

#ifdef ICET_TESTS_USE_OPENGL
  /* Create a renderable window. */
    glutInitDisplayMode(GLUT_RGBA | GLUT_DOUBLE | GLUT_DEPTH | GLUT_ALPHA);
    glutInitWindowPosition(0, 0);
    glutInitWindowSize(width, height);

    {
        char title[256];
        sprintf(title, "IceT Test %d of %d", rank, num_proc);
        windowId = glutCreateWindow(title);
    }
#endif /* ICET_TESTS_USE_OPENGL */

    SCREEN_WIDTH = width;
    SCREEN_HEIGHT = height;

  /* Create an IceT context. */
    context = icetCreateContext(comm);
    icetDiagnostics(diag_level);
#ifdef ICET_TESTS_USE_OPENGL
    icetGLInitialize();
#endif

  /* Redirect standard output on demand. */
    if (redirect) {
        char filename[64];
        int outfd;
        if (rank == 0) {
            realstdout = fdopen(dup(1), "wt");
        } else {
            realstdout = NULL;
        }
        sprintf(filename, "log.%04d", rank);
        outfd = open(filename, O_WRONLY | O_CREAT | O_APPEND, 0644);
        if (outfd < 0) {
            printf("Could not open %s for writing.\n", filename);
            exit(1);
        }
        dup2(outfd, 1);
    } else {
        realstdout = stdout;
    }

    strategy_list[0] = ICET_STRATEGY_DIRECT;
    strategy_list[1] = ICET_STRATEGY_SEQUENTIAL;
    strategy_list[2] = ICET_STRATEGY_SPLIT;
    strategy_list[3] = ICET_STRATEGY_REDUCE;
    strategy_list[4] = ICET_STRATEGY_VTREE;

    single_image_strategy_list[0] = ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC;
    single_image_strategy_list[1] = ICET_SINGLE_IMAGE_STRATEGY_BSWAP;
    single_image_strategy_list[2] = ICET_SINGLE_IMAGE_STRATEGY_RADIXK;
    single_image_strategy_list[3] = ICET_SINGLE_IMAGE_STRATEGY_TREE;
}